

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_ArrayIo_Test::TestBody(IoTest_ArrayIo_Test *this)

{
  int block_size;
  int size;
  bool read_eof;
  ZeroCopyOutputStream *output_00;
  long lVar1;
  int i;
  long lVar2;
  ArrayOutputStream output;
  uint8_t buffer [256];
  ArrayInputStream AStack_158;
  ZeroCopyOutputStream local_138 [33];
  
  lVar2 = 0;
  do {
    block_size = (&io::(anonymous_namespace)::IoTest::kBlockSizes)[lVar2];
    lVar1 = 0;
    do {
      output_00 = local_138;
      ArrayOutputStream::ArrayOutputStream
                ((ArrayOutputStream *)&AStack_158,local_138,0x100,block_size);
      size = IoTest::WriteStuff((IoTest *)&AStack_158,output_00);
      ArrayInputStream::ArrayInputStream
                (&AStack_158,local_138,size,
                 *(int *)((long)&io::(anonymous_namespace)::IoTest::kBlockSizes + lVar1));
      IoTest::ReadStuff((IoTest *)&AStack_158,(ZeroCopyInputStream *)0x1,read_eof);
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0x20);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

TEST_F(IoTest, ArrayIo) {
  const int kBufferSize = 256;
  uint8_t buffer[kBufferSize];

  for (int i = 0; i < kBlockSizeCount; i++) {
    for (int j = 0; j < kBlockSizeCount; j++) {
      int size;
      {
        ArrayOutputStream output(buffer, kBufferSize, kBlockSizes[i]);
        size = WriteStuff(&output);
      }
      {
        ArrayInputStream input(buffer, size, kBlockSizes[j]);
        ReadStuff(&input);
      }
    }
  }
}